

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall TPZMatrix<Fad<double>_>::Decompose_LU(TPZMatrix<Fad<double>_> *this)

{
  long lVar1;
  double dVar2;
  byte bVar3;
  Fad<double> *pFVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_110;
  FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_100;
  Fad<double> local_f0;
  Fad<double> pivot;
  undefined1 local_b0 [32];
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> nn;
  
  bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar3) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar3 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar3 == 0) {
    Fad<double>::Fad(&nn);
    Fad<double>::Fad(&pivot);
    lVar5 = (this->super_TPZBaseMatrix).fRow;
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 < lVar5) {
      lVar5 = lVar1;
    }
    if (lVar5 < 1) {
      lVar5 = 0;
    }
    lVar1 = 0;
    while( true ) {
      lVar8 = lVar1;
      if (lVar8 == lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_f0,this,lVar8,lVar8);
      pFVar4 = Fad<double>::operator=(&pivot,&local_f0);
      Fad<double>::Fad(&local_70,pFVar4);
      dVar2 = ABS(local_70.val_);
      Fad<double>::~Fad(&local_70);
      Fad<double>::~Fad(&local_f0);
      if (dVar2 < 1e-12) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
      }
      lVar1 = lVar8 + 1;
      for (lVar7 = lVar1; lVar7 < (this->super_TPZBaseMatrix).fRow; lVar7 = lVar7 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_f0,this,lVar7,lVar8);
        local_b0._8_8_ = &pivot;
        local_b0._0_8_ = &local_f0;
        Fad<double>::operator=(&nn,(FadExpr<FadBinaryDiv<Fad<double>,_Fad<double>_>_> *)local_b0);
        Fad<double>::~Fad(&local_f0);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar7,lVar8,&nn)
        ;
        for (lVar6 = lVar1; lVar6 < (this->super_TPZBaseMatrix).fCol; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    ((Fad<double> *)local_b0,this,lVar7,lVar6);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_90,this,lVar8,lVar6);
          local_100.fadexpr_.right_ = &local_110;
          local_110.fadexpr_.left_ = &nn;
          local_110.fadexpr_.right_ = &local_90;
          local_100.fadexpr_.left_ = (Fad<double> *)local_b0;
          Fad<double>::
          Fad<FadBinaryMinus<Fad<double>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
                    (&local_f0,&local_100);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar7,lVar6,&local_f0);
          Fad<double>::~Fad(&local_f0);
          Fad<double>::~Fad(&local_90);
          Fad<double>::~Fad((Fad<double> *)local_b0);
        }
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
    Fad<double>::~Fad(&pivot);
    Fad<double>::~Fad(&nn);
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}